

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::VisionFeaturePrint_Objects
          (VisionFeaturePrint_Objects *this,VisionFeaturePrint_Objects *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__VisionFeaturePrint_Objects_003dbf68;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->output_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->output_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->output_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->output_).super_RepeatedPtrFieldBase,&(from->output_).super_RepeatedPtrFieldBase
            );
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->version_ = from->version_;
  return;
}

Assistant:

VisionFeaturePrint_Objects::VisionFeaturePrint_Objects(const VisionFeaturePrint_Objects& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      output_(from.output_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  version_ = from.version_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
}